

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

SwitchStmt * new_switch_stmt(void *expr,List *cases,void *defexpr)

{
  Token *pTVar1;
  void *any;
  SwitchStmt *pSVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x28);
  pSVar2 = (SwitchStmt *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node((Token *)0x0,switch_eval);
  pTVar1 = pTVar3->token;
  (pSVar2->node).eval = pTVar3->eval;
  (pSVar2->node).token = pTVar1;
  pSVar2->expr = expr;
  pSVar2->cases = cases;
  pSVar2->t_default = defexpr;
  return pSVar2;
}

Assistant:

SwitchStmt* new_switch_stmt(void* expr, List* cases, void* defexpr){
    SwitchStmt* stmt = new(SwitchStmt);
    stmt->node = tree_node_(NULL, eval_handler(switch_eval));
    stmt->expr = expr;
    stmt->cases = cases;
    stmt->t_default = defexpr;
    return stmt;
}